

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UBool CReg::unreg(UCurrRegistryKey key)

{
  void *in_RSI;
  CReg *local_20;
  CReg **p;
  UBool found;
  UCurrRegistryKey key_local;
  
  p._7_1_ = '\0';
  umtx_lock_63(&gCRegLock);
  local_20 = (CReg *)&gCRegHead;
  do {
    if (local_20->next == (CReg *)0x0) {
LAB_00372a86:
      umtx_unlock_63(&gCRegLock);
      return p._7_1_;
    }
    if (local_20->next == (CReg *)key) {
      local_20->next = *key;
      if (key != (UCurrRegistryKey)0x0) {
        icu_63::UMemory::operator_delete((UMemory *)key,in_RSI);
      }
      p._7_1_ = '\x01';
      goto LAB_00372a86;
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

static UBool unreg(UCurrRegistryKey key) {
        UBool found = FALSE;
        umtx_lock(&gCRegLock);

        CReg** p = &gCRegHead;
        while (*p) {
            if (*p == key) {
                *p = ((CReg*)key)->next;
                delete (CReg*)key;
                found = TRUE;
                break;
            }
            p = &((*p)->next);
        }

        umtx_unlock(&gCRegLock);
        return found;
    }